

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintNpnClasses(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  char **ppcVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *vVisited;
  Vec_Int_t *vTruth;
  void *__ptr;
  Vec_Int_t *pVVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  int ClassCounts [222];
  uint local_3a8 [222];
  
  ppcVar3 = Kit_DsdNpn4ClassNames();
  memset(local_3a8,0,0x378);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                  ,0x323,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
  }
  iVar2 = Gia_ManLutSizeMax(p);
  if (4 < iVar2) {
    __assert_fail("Gia_ManLutSizeMax( p ) <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                  ,0x324,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
  }
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  vVisited = (Vec_Int_t *)malloc(0x10);
  vVisited->nCap = 100;
  vVisited->nSize = 0;
  piVar5 = (int *)malloc(400);
  vVisited->pArray = piVar5;
  vTruth = (Vec_Int_t *)malloc(0x10);
  vTruth->nCap = 0x10000;
  vTruth->nSize = 0;
  piVar5 = (int *)malloc(0x40000);
  vTruth->pArray = piVar5;
  __ptr = calloc((long)p->nObjs,4);
  Gia_ManCleanTruth(p);
  iVar2 = p->nObjs;
  if (1 < iVar2) {
    lVar19 = 1;
    do {
      pVVar6 = p->vMapping;
      if (pVVar6->nSize <= lVar19) goto LAB_0021a764;
      uVar16 = pVVar6->pArray[lVar19];
      if ((ulong)uVar16 != 0) {
        if (((int)uVar16 < 0) || ((uint)pVVar6->nSize <= uVar16)) goto LAB_0021a764;
        if (pVVar6->pArray[uVar16] < 5) {
          pVVar4->nSize = 0;
          lVar8 = (long)pVVar6->nSize;
          if (lVar8 <= lVar19) goto LAB_0021a764;
          iVar2 = 4;
          uVar11 = 0;
          while( true ) {
            piVar5 = pVVar6->pArray;
            lVar9 = (long)piVar5[lVar19];
            if ((lVar9 < 0) || ((uint)lVar8 <= (uint)piVar5[lVar19])) goto LAB_0021a764;
            if ((long)piVar5[lVar9] <= (long)uVar11) break;
            Vec_IntPush(pVVar4,piVar5[lVar9 + uVar11 + 1]);
            uVar11 = uVar11 + 1;
            pVVar6 = p->vMapping;
            lVar8 = (long)pVVar6->nSize;
            iVar2 = iVar2 + -1;
            if (lVar8 <= lVar19) goto LAB_0021a764;
          }
          if (uVar11 < 4) {
            do {
              Vec_IntPush(pVVar4,0);
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
          if (p->nObjs <= lVar19) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          puVar7 = Gia_ManConvertAigToTruth(p,p->pObjs + lVar19,pVVar4,vTruth,vVisited);
          iVar2 = Dar_LibReturnClass(*puVar7);
          local_3a8[iVar2] = local_3a8[iVar2] + 1;
          *(int *)((long)__ptr + lVar19 * 4) = iVar2;
          iVar2 = p->nObjs;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar2);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  if (vTruth->pArray != (int *)0x0) {
    free(vTruth->pArray);
  }
  free(vTruth);
  if (vVisited->pArray != (int *)0x0) {
    free(vVisited->pArray);
  }
  free(vVisited);
  pVVar4 = p->vTruths;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vTruths->pArray = (int *)0x0;
      pVVar4 = p->vTruths;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0021a4ec;
    }
    free(pVVar4);
    p->vTruths = (Vec_Int_t *)0x0;
  }
LAB_0021a4ec:
  lVar19 = 0;
  uVar16 = 0;
  do {
    uVar16 = uVar16 + local_3a8[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0xde);
  uVar11 = 0;
  Abc_Print((int)pVVar4,"NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n",
            (ulong)uVar16);
  dVar21 = (double)(int)(uVar16 + 1);
  iVar2 = 0;
  uVar18 = 0;
  do {
    uVar1 = local_3a8[uVar11];
    if (uVar1 != 0) {
      iVar2 = iVar2 + uVar1;
      uVar18 = uVar18 + 1;
      Abc_Print((int)pVVar4,"%3d: Class %3d :  Count = %6d   (%7.2f %%)   %s\n",
                ((double)(int)uVar1 * 100.0) / dVar21,(ulong)uVar18,uVar11 & 0xffffffff,(ulong)uVar1
                ,ppcVar3[uVar11]);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0xde);
  Abc_Print((int)pVVar4,"Other     :  Count = %6d   (%7.2f %%)\n",
            ((double)(int)(uVar16 - iVar2) * 100.0) / dVar21,(ulong)(uVar16 - iVar2));
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManSetRefsMapped(p);
  uVar18 = 0;
  uVar16 = 0;
  if (1 < (long)p->nObjs) {
    uVar1 = p->vMapping->nSize;
    uVar11 = 1;
    if (1 < (int)uVar1) {
      uVar11 = (ulong)uVar1;
    }
    uVar16 = 0;
    uVar12 = 1;
    uVar18 = 0;
    do {
      if (uVar12 == uVar11) {
LAB_0021a764:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = p->vMapping->pArray;
      uVar13 = piVar5[uVar12];
      uVar15 = (ulong)uVar13;
      if ((uVar15 != 0) && (*(int *)((long)__ptr + uVar12 * 4) == 0x6d)) {
        if (((int)uVar13 < 0) || (uVar1 <= uVar13)) goto LAB_0021a764;
        uVar13 = 0;
        uVar14 = 0;
        if (0 < piVar5[uVar15]) {
          uVar14 = 0;
          uVar13 = 0;
          uVar17 = 0;
          do {
            uVar10 = 0;
            bVar20 = *(int *)((long)__ptr + (long)piVar5[uVar15 + uVar17 + 1] * 4) == 0x6d;
            if (bVar20) {
              uVar10 = (uint)(p->pRefs[piVar5[uVar15 + uVar17 + 1]] == 1);
            }
            uVar13 = uVar13 + uVar10;
            uVar14 = uVar14 + bVar20;
            uVar17 = uVar17 + 1;
          } while ((uint)piVar5[uVar15] != uVar17);
          uVar14 = (uint)(1 < uVar14);
          uVar13 = (uint)(1 < uVar13);
        }
        uVar18 = uVar18 + uVar14;
        uVar16 = uVar16 + uVar13;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (long)p->nObjs);
  }
  piVar5 = p->pRefs;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    p->pRefs = (int *)0x0;
  }
  Abc_Print((int)piVar5,
            "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n"
            ,((double)(int)uVar18 * 100.0) / dVar21,((double)(int)uVar16 * 100.0) / dVar21,
            (ulong)uVar18,(ulong)uVar16);
  if (__ptr != (void *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Gia_ManPrintNpnClasses( Gia_Man_t * p )
{
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    int * pLutClass, ClassCounts[222] = {0};
    int i, k, iFan, Class, OtherClasses, OtherClasses2, nTotal, Counter, Counter2;
    unsigned * pTruth;
    assert( Gia_ManHasMapping(p) );
    assert(  Gia_ManLutSizeMax( p ) <= 4 );
    vLeaves   = Vec_IntAlloc( 100 );
    vVisited  = Vec_IntAlloc( 100 );
    vTruth    = Vec_IntAlloc( (1<<16) );
    pLutClass = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManCleanTruth( p );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutSize(p,i) > 4 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        for ( ; k < 4; k++ )
            Vec_IntPush( vLeaves, 0 );
        pTruth = Gia_ManConvertAigToTruth( p, Gia_ManObj(p, i), vLeaves, vTruth, vVisited );
        Class = Dar_LibReturnClass( *pTruth );
        ClassCounts[ Class ]++;
        pLutClass[i] = Class;
    }
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    Vec_IntFreeP( &p->vTruths );
    nTotal = 0;
    for ( i = 0; i < 222; i++ )
        nTotal += ClassCounts[i];
    Abc_Print( 1, "NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n", nTotal );
    OtherClasses = 0;
    for ( i = k = 0; i < 222; i++ )
    {
        if ( ClassCounts[i] == 0 )
            continue;
//        if ( 100.0 * ClassCounts[i] / (nTotal+1) < 0.1 ) // do not show anything below 0.1 percent
//            continue;
        OtherClasses += ClassCounts[i];
        Abc_Print( 1, "%3d: Class %3d :  Count = %6d   (%7.2f %%)   %s\n", 
            ++k, i, ClassCounts[i], 100.0 * ClassCounts[i] / (nTotal+1), pNames[i] );
    }
    OtherClasses = nTotal - OtherClasses;
    Abc_Print( 1, "Other     :  Count = %6d   (%7.2f %%)\n", 
        OtherClasses, 100.0 * OtherClasses / (nTotal+1) );
    // count the number of LUTs that have MUX function and two fanins with MUX functions
    OtherClasses = OtherClasses2 = 0;
    ABC_FREE( p->pRefs );
    Gia_ManSetRefsMapped( p );
    Gia_ManForEachLut( p, i )
    {
        if ( pLutClass[i] != 109 )
            continue;
        Counter = Counter2 = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            Counter  += (pLutClass[iFan] == 109);
            Counter2 += (pLutClass[iFan] == 109) && (Gia_ObjRefNumId(p, iFan) == 1);
        }
        OtherClasses  += (Counter > 1);
        OtherClasses2 += (Counter2 > 1);
//            Abc_Print( 1, "%d -- ", pLutClass[i] );
//            Gia_LutForEachFanin( p, i, iFan, k )
//                Abc_Print( 1, "%d ", pLutClass[iFan] );
//            Abc_Print( 1, "\n" );
    }
    ABC_FREE( p->pRefs );
    Abc_Print( 1, "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n", 
        OtherClasses,  100.0 * OtherClasses  / (nTotal+1),
        OtherClasses2, 100.0 * OtherClasses2 / (nTotal+1) );
    ABC_FREE( pLutClass );
}